

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O3

void hash_destroy(HashTable *table)

{
  MOJOSHADER_free UNRECOVERED_JUMPTABLE;
  void *pvVar1;
  void *pvVar2;
  HashItem *pHVar3;
  uint uVar4;
  ulong uVar5;
  HashItem *pHVar6;
  
  UNRECOVERED_JUMPTABLE = table->f;
  pvVar1 = table->d;
  uVar4 = table->table_len;
  if (uVar4 != 0) {
    pvVar2 = table->data;
    uVar5 = 0;
    do {
      pHVar6 = table->table[uVar5];
      if (pHVar6 != (HashItem *)0x0) {
        do {
          pHVar3 = pHVar6->next;
          (*table->nuke)(pHVar6->key,pHVar6->value,pvVar2);
          (*UNRECOVERED_JUMPTABLE)(pHVar6,pvVar1);
          pHVar6 = pHVar3;
        } while (pHVar3 != (HashItem *)0x0);
        uVar4 = table->table_len;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar4);
  }
  (*UNRECOVERED_JUMPTABLE)(table->table,pvVar1);
  (*UNRECOVERED_JUMPTABLE)(table,pvVar1);
  return;
}

Assistant:

void hash_destroy(HashTable *table)
{
    uint32 i;
    void *data = table->data;
    MOJOSHADER_free f = table->f;
    void *d = table->d;
    for (i = 0; i < table->table_len; i++)
    {
        HashItem *item = table->table[i];
        while (item != NULL)
        {
            HashItem *next = item->next;
            table->nuke(item->key, item->value, data);
            f(item, d);
            item = next;
        } // while
    } // for

    f(table->table, d);
    f(table, d);
}